

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BlockEventListControl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BlockEventListControl,std::span<slang::ast::BlockEventListControl::Event,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,
          span<slang::ast::BlockEventListControl::Event,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  pointer pEVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  BlockEventListControl *pBVar5;
  
  pBVar5 = (BlockEventListControl *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BlockEventListControl *)this->endPtr < pBVar5 + 1) {
    pBVar5 = (BlockEventListControl *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pBVar5 + 1);
  }
  pEVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  SVar3 = args_1->startLoc;
  SVar4 = args_1->endLoc;
  (pBVar5->super_TimingControl).kind = BlockEventList;
  (pBVar5->super_TimingControl).syntax = (SyntaxNode *)0x0;
  (pBVar5->super_TimingControl).sourceRange.startLoc = SVar3;
  (pBVar5->super_TimingControl).sourceRange.endLoc = SVar4;
  (pBVar5->events)._M_ptr = pEVar1;
  (pBVar5->events)._M_extent._M_extent_value = sVar2;
  return pBVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }